

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test::
~TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test
          (TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test *this)

{
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test *mem;
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_Not_NoPointsHand_DragonPair_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_NoPointsHand_DragonPair)
{
	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}